

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

string * __thiscall
XrSdkLogObjectInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,XrSdkLogObjectInfo *this)

{
  ostream *poVar1;
  ostringstream oss;
  uint64_t in_stack_fffffffffffffe58;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  Uint64ToHexString_abi_cxx11_(in_stack_fffffffffffffe58);
  std::operator<<((ostream *)local_188,(string *)&stack0xfffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  if ((this->name)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)local_188," (");
    poVar1 = std::operator<<(poVar1,(string *)&this->name);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string XrSdkLogObjectInfo::ToString() const {
    std::ostringstream oss;
    oss << Uint64ToHexString(handle);
    if (!name.empty()) {
        oss << " (" << name << ")";
    }
    return oss.str();
}